

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O2

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::maxInfeas(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *__return_storage_ptr__,
           SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this)

{
  bool bVar1;
  int iVar2;
  fpclass_type fVar3;
  int32_t iVar4;
  pointer pnVar5;
  undefined8 uVar6;
  type_conflict5 tVar7;
  int *piVar8;
  bool *pbVar9;
  pointer pnVar10;
  fpclass_type *pfVar11;
  int i_2;
  int32_t *piVar12;
  long lVar13;
  int i;
  long lVar14;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_c8;
  int32_t *local_88;
  fpclass_type *local_80;
  bool *local_78;
  int *local_70;
  cpp_dec_float<50U,_int,_void> local_68;
  
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&__return_storage_ptr__->m_backend,0.0,(type *)0x0);
  if (this->theType == ENTER) {
    if ((this->m_pricingViolUpToDate != false) && (this->m_pricingViolCoUpToDate == true)) {
      local_c8.fpclass = cpp_dec_float_finite;
      local_c8.prec_elem = 10;
      local_c8.data._M_elems[0] = 0;
      local_c8.data._M_elems[1] = 0;
      local_c8.data._M_elems[2] = 0;
      local_c8.data._M_elems[3] = 0;
      local_c8.data._M_elems[4] = 0;
      local_c8.data._M_elems[5] = 0;
      local_c8.data._M_elems._24_5_ = 0;
      local_c8.data._M_elems[7]._1_3_ = 0;
      local_c8.data._M_elems._32_5_ = 0;
      local_c8.data._M_elems[9]._1_3_ = 0;
      local_c8.exp = 0;
      local_c8.neg = false;
      boost::multiprecision::default_ops::
      eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&local_c8,&(this->m_pricingViol).m_backend,&(this->m_pricingViolCo).m_backend);
      *(ulong *)((__return_storage_ptr__->m_backend).data._M_elems + 8) =
           CONCAT35(local_c8.data._M_elems[9]._1_3_,local_c8.data._M_elems._32_5_);
      *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) =
           local_c8.data._M_elems._16_8_;
      *(ulong *)((__return_storage_ptr__->m_backend).data._M_elems + 6) =
           CONCAT35(local_c8.data._M_elems[7]._1_3_,local_c8.data._M_elems._24_5_);
      *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems =
           local_c8.data._M_elems._0_8_;
      *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) =
           local_c8.data._M_elems._8_8_;
      (__return_storage_ptr__->m_backend).exp = local_c8.exp;
      (__return_storage_ptr__->m_backend).neg = local_c8.neg;
      (__return_storage_ptr__->m_backend).fpclass = local_c8.fpclass;
      (__return_storage_ptr__->m_backend).prec_elem = local_c8.prec_elem;
    }
    local_70 = &(__return_storage_ptr__->m_backend).exp;
    local_78 = &(__return_storage_ptr__->m_backend).neg;
    local_80 = &(__return_storage_ptr__->m_backend).fpclass;
    local_88 = &(__return_storage_ptr__->m_backend).prec_elem;
    lVar14 = 0;
    for (lVar13 = 0; lVar13 < (this->thecovectors->set).thenum; lVar13 = lVar13 + 1) {
      tVar7 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)((long)&((this->theFvec->
                                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     ).val.
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->m_backend + lVar14)
                         ,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)&(((this->theUBbound).val.
                                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->m_backend).data +
                             lVar14));
      if (tVar7) {
        local_68.fpclass = cpp_dec_float_finite;
        local_68.prec_elem = 10;
        local_68.data._M_elems[0] = 0;
        local_68.data._M_elems[1] = 0;
        local_68.data._M_elems[2] = 0;
        local_68.data._M_elems[3] = 0;
        local_68.data._M_elems[4] = 0;
        local_68.data._M_elems[5] = 0;
        local_68.data._M_elems._24_5_ = 0;
        local_68.data._M_elems[7]._1_3_ = 0;
        local_68.data._M_elems._32_5_ = 0;
        local_68._37_8_ = 0;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_68,
                   (cpp_dec_float<50U,_int,_void> *)
                   ((long)&((this->theFvec->
                            super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_backend + lVar14),
                   (cpp_dec_float<50U,_int,_void> *)
                   ((long)&(((this->theUBbound).val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + lVar14));
        tVar7 = boost::multiprecision::operator>
                          (__return_storage_ptr__,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_68);
        if (tVar7) {
LAB_001eed1c:
          uVar6 = *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 8);
          local_c8.data._M_elems._32_5_ = SUB85(uVar6,0);
          local_c8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
          local_c8.data._M_elems._0_8_ =
               *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems;
          local_c8.data._M_elems._8_8_ =
               *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2);
          local_c8.data._M_elems._16_8_ =
               *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4);
          uVar6 = *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 6);
          local_c8.data._M_elems._24_5_ = SUB85(uVar6,0);
          local_c8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
          piVar8 = local_70;
          pbVar9 = local_78;
          pfVar11 = local_80;
          piVar12 = local_88;
        }
        else {
          pnVar5 = (this->theFvec->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pnVar10 = (this->theUBbound).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
LAB_001eed5f:
          local_c8.fpclass = cpp_dec_float_finite;
          local_c8.prec_elem = 10;
          local_c8.data._M_elems[0] = 0;
          local_c8.data._M_elems[1] = 0;
          local_c8.data._M_elems[2] = 0;
          local_c8.data._M_elems[3] = 0;
          local_c8.data._M_elems[4] = 0;
          local_c8.data._M_elems[5] = 0;
          local_c8.data._M_elems._24_5_ = 0;
          local_c8.data._M_elems[7]._1_3_ = 0;
          local_c8.data._M_elems._32_5_ = 0;
          local_c8.data._M_elems[9]._1_3_ = 0;
          local_c8.exp = 0;
          local_c8.neg = false;
          boost::multiprecision::default_ops::
          eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&local_c8,
                     (cpp_dec_float<50U,_int,_void> *)((long)&(pnVar5->m_backend).data + lVar14),
                     (cpp_dec_float<50U,_int,_void> *)((long)&(pnVar10->m_backend).data + lVar14));
          piVar8 = &local_c8.exp;
          pbVar9 = &local_c8.neg;
          pfVar11 = &local_c8.fpclass;
          piVar12 = &local_c8.prec_elem;
        }
        iVar2 = *piVar8;
        bVar1 = *pbVar9;
        fVar3 = *pfVar11;
        iVar4 = *piVar12;
        *(ulong *)((__return_storage_ptr__->m_backend).data._M_elems + 8) =
             CONCAT35(local_c8.data._M_elems[9]._1_3_,local_c8.data._M_elems._32_5_);
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) =
             local_c8.data._M_elems._16_8_;
        *(ulong *)((__return_storage_ptr__->m_backend).data._M_elems + 6) =
             CONCAT35(local_c8.data._M_elems[7]._1_3_,local_c8.data._M_elems._24_5_);
        *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems =
             local_c8.data._M_elems._0_8_;
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) =
             local_c8.data._M_elems._8_8_;
        (__return_storage_ptr__->m_backend).exp = iVar2;
        (__return_storage_ptr__->m_backend).neg = bVar1;
        (__return_storage_ptr__->m_backend).fpclass = fVar3;
        (__return_storage_ptr__->m_backend).prec_elem = iVar4;
      }
      else {
        tVar7 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)((long)&((this->theFvec->
                                       super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       ).val.
                                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->m_backend +
                              lVar14),
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)((long)&(((this->theLBbound).val.
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->m_backend).data
                              + lVar14));
        if (tVar7) {
          local_68.fpclass = cpp_dec_float_finite;
          local_68.prec_elem = 10;
          local_68.data._M_elems[0] = 0;
          local_68.data._M_elems[1] = 0;
          local_68.data._M_elems[2] = 0;
          local_68.data._M_elems[3] = 0;
          local_68.data._M_elems[4] = 0;
          local_68.data._M_elems[5] = 0;
          local_68.data._M_elems._24_5_ = 0;
          local_68.data._M_elems[7]._1_3_ = 0;
          local_68.data._M_elems._32_5_ = 0;
          local_68._37_8_ = 0;
          boost::multiprecision::default_ops::
          eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&local_68,
                     (cpp_dec_float<50U,_int,_void> *)
                     ((long)&(((this->theLBbound).val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + lVar14)
                     ,(cpp_dec_float<50U,_int,_void> *)
                      ((long)&((this->theFvec->
                               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_backend + lVar14));
          tVar7 = boost::multiprecision::operator>
                            (__return_storage_ptr__,
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_68);
          if (tVar7) goto LAB_001eed1c;
          pnVar5 = (this->theLBbound).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pnVar10 = (this->theFvec->
                    super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          goto LAB_001eed5f;
        }
      }
      lVar14 = lVar14 + 0x38;
    }
  }
  else {
    if (this->m_pricingViolUpToDate != false) {
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&__return_storage_ptr__->m_backend,&(this->m_pricingViol).m_backend);
    }
    local_70 = &(__return_storage_ptr__->m_backend).exp;
    local_78 = &(__return_storage_ptr__->m_backend).neg;
    local_80 = &(__return_storage_ptr__->m_backend).fpclass;
    local_88 = &(__return_storage_ptr__->m_backend).prec_elem;
    lVar13 = 0;
    for (lVar14 = 0; lVar14 < (this->thecovectors->set).thenum; lVar14 = lVar14 + 1) {
      tVar7 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)((long)&((this->theCoPvec->
                                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     ).val.
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->m_backend + lVar13)
                         ,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)&(((this->theCoUbound->val).
                                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->m_backend).data +
                             lVar13));
      if (tVar7) {
        local_68.fpclass = cpp_dec_float_finite;
        local_68.prec_elem = 10;
        local_68.data._M_elems[0] = 0;
        local_68.data._M_elems[1] = 0;
        local_68.data._M_elems[2] = 0;
        local_68.data._M_elems[3] = 0;
        local_68.data._M_elems[4] = 0;
        local_68.data._M_elems[5] = 0;
        local_68.data._M_elems._24_5_ = 0;
        local_68.data._M_elems[7]._1_3_ = 0;
        local_68.data._M_elems._32_5_ = 0;
        local_68._37_8_ = 0;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_68,
                   (cpp_dec_float<50U,_int,_void> *)
                   ((long)&((this->theCoPvec->
                            super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_backend + lVar13),
                   (cpp_dec_float<50U,_int,_void> *)
                   ((long)&(((this->theCoUbound->val).
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + lVar13));
        tVar7 = boost::multiprecision::operator>
                          (__return_storage_ptr__,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_68);
        if (tVar7) {
LAB_001ee8e4:
          uVar6 = *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 8);
          local_c8.data._M_elems._32_5_ = SUB85(uVar6,0);
          local_c8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
          local_c8.data._M_elems._0_8_ =
               *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems;
          local_c8.data._M_elems._8_8_ =
               *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2);
          local_c8.data._M_elems._16_8_ =
               *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4);
          uVar6 = *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 6);
          local_c8.data._M_elems._24_5_ = SUB85(uVar6,0);
          local_c8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
          piVar8 = local_70;
          pbVar9 = local_78;
          pfVar11 = local_80;
          piVar12 = local_88;
        }
        else {
          pnVar5 = (this->theCoPvec->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pnVar10 = (this->theCoUbound->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
LAB_001ee92a:
          local_c8.fpclass = cpp_dec_float_finite;
          local_c8.prec_elem = 10;
          local_c8.data._M_elems[0] = 0;
          local_c8.data._M_elems[1] = 0;
          local_c8.data._M_elems[2] = 0;
          local_c8.data._M_elems[3] = 0;
          local_c8.data._M_elems[4] = 0;
          local_c8.data._M_elems[5] = 0;
          local_c8.data._M_elems._24_5_ = 0;
          local_c8.data._M_elems[7]._1_3_ = 0;
          local_c8.data._M_elems._32_5_ = 0;
          local_c8.data._M_elems[9]._1_3_ = 0;
          local_c8.exp = 0;
          local_c8.neg = false;
          boost::multiprecision::default_ops::
          eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&local_c8,
                     (cpp_dec_float<50U,_int,_void> *)((long)&(pnVar5->m_backend).data + lVar13),
                     (cpp_dec_float<50U,_int,_void> *)((long)&(pnVar10->m_backend).data + lVar13));
          piVar8 = &local_c8.exp;
          pbVar9 = &local_c8.neg;
          pfVar11 = &local_c8.fpclass;
          piVar12 = &local_c8.prec_elem;
        }
        iVar2 = *piVar8;
        bVar1 = *pbVar9;
        fVar3 = *pfVar11;
        iVar4 = *piVar12;
        *(ulong *)((__return_storage_ptr__->m_backend).data._M_elems + 8) =
             CONCAT35(local_c8.data._M_elems[9]._1_3_,local_c8.data._M_elems._32_5_);
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) =
             local_c8.data._M_elems._16_8_;
        *(ulong *)((__return_storage_ptr__->m_backend).data._M_elems + 6) =
             CONCAT35(local_c8.data._M_elems[7]._1_3_,local_c8.data._M_elems._24_5_);
        *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems =
             local_c8.data._M_elems._0_8_;
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) =
             local_c8.data._M_elems._8_8_;
        (__return_storage_ptr__->m_backend).exp = iVar2;
        (__return_storage_ptr__->m_backend).neg = bVar1;
        (__return_storage_ptr__->m_backend).fpclass = fVar3;
        (__return_storage_ptr__->m_backend).prec_elem = iVar4;
      }
      else {
        tVar7 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)((long)&((this->theCoPvec->
                                       super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       ).val.
                                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->m_backend +
                              lVar13),
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)((long)&(((this->theCoLbound->val).
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->m_backend).data
                              + lVar13));
        if (tVar7) {
          local_68.fpclass = cpp_dec_float_finite;
          local_68.prec_elem = 10;
          local_68.data._M_elems[0] = 0;
          local_68.data._M_elems[1] = 0;
          local_68.data._M_elems[2] = 0;
          local_68.data._M_elems[3] = 0;
          local_68.data._M_elems[4] = 0;
          local_68.data._M_elems[5] = 0;
          local_68.data._M_elems._24_5_ = 0;
          local_68.data._M_elems[7]._1_3_ = 0;
          local_68.data._M_elems._32_5_ = 0;
          local_68._37_8_ = 0;
          boost::multiprecision::default_ops::
          eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&local_68,
                     (cpp_dec_float<50U,_int,_void> *)
                     ((long)&(((this->theCoLbound->val).
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + lVar13)
                     ,(cpp_dec_float<50U,_int,_void> *)
                      ((long)&((this->theCoPvec->
                               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_backend + lVar13));
          tVar7 = boost::multiprecision::operator>
                            (__return_storage_ptr__,
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_68);
          if (tVar7) goto LAB_001ee8e4;
          pnVar5 = (this->theCoLbound->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pnVar10 = (this->theCoPvec->
                    super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          goto LAB_001ee92a;
        }
      }
      lVar13 = lVar13 + 0x38;
    }
    lVar13 = 0;
    for (lVar14 = 0; lVar14 < (this->thevectors->set).thenum; lVar14 = lVar14 + 1) {
      tVar7 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)((long)&((this->thePvec->
                                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     ).val.
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->m_backend + lVar13)
                         ,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)&(((this->theUbound->val).
                                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->m_backend).data +
                             lVar13));
      if (tVar7) {
        local_68.fpclass = cpp_dec_float_finite;
        local_68.prec_elem = 10;
        local_68.data._M_elems[0] = 0;
        local_68.data._M_elems[1] = 0;
        local_68.data._M_elems[2] = 0;
        local_68.data._M_elems[3] = 0;
        local_68.data._M_elems[4] = 0;
        local_68.data._M_elems[5] = 0;
        local_68.data._M_elems._24_5_ = 0;
        local_68.data._M_elems[7]._1_3_ = 0;
        local_68.data._M_elems._32_5_ = 0;
        local_68._37_8_ = 0;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_68,
                   (cpp_dec_float<50U,_int,_void> *)
                   ((long)&((this->thePvec->
                            super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_backend + lVar13),
                   (cpp_dec_float<50U,_int,_void> *)
                   ((long)&(((this->theUbound->val).
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + lVar13));
        tVar7 = boost::multiprecision::operator>
                          (__return_storage_ptr__,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_68);
        if (tVar7) {
LAB_001eeab7:
          uVar6 = *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 8);
          local_c8.data._M_elems._32_5_ = SUB85(uVar6,0);
          local_c8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
          local_c8.data._M_elems._0_8_ =
               *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems;
          local_c8.data._M_elems._8_8_ =
               *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2);
          local_c8.data._M_elems._16_8_ =
               *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4);
          uVar6 = *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 6);
          local_c8.data._M_elems._24_5_ = SUB85(uVar6,0);
          local_c8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
          piVar8 = local_70;
          pbVar9 = local_78;
          pfVar11 = local_80;
          piVar12 = local_88;
        }
        else {
          pnVar5 = (this->thePvec->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pnVar10 = (this->theUbound->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
LAB_001eeafd:
          local_c8.fpclass = cpp_dec_float_finite;
          local_c8.prec_elem = 10;
          local_c8.data._M_elems[0] = 0;
          local_c8.data._M_elems[1] = 0;
          local_c8.data._M_elems[2] = 0;
          local_c8.data._M_elems[3] = 0;
          local_c8.data._M_elems[4] = 0;
          local_c8.data._M_elems[5] = 0;
          local_c8.data._M_elems._24_5_ = 0;
          local_c8.data._M_elems[7]._1_3_ = 0;
          local_c8.data._M_elems._32_5_ = 0;
          local_c8.data._M_elems[9]._1_3_ = 0;
          local_c8.exp = 0;
          local_c8.neg = false;
          boost::multiprecision::default_ops::
          eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&local_c8,
                     (cpp_dec_float<50U,_int,_void> *)((long)&(pnVar5->m_backend).data + lVar13),
                     (cpp_dec_float<50U,_int,_void> *)((long)&(pnVar10->m_backend).data + lVar13));
          piVar8 = &local_c8.exp;
          pbVar9 = &local_c8.neg;
          pfVar11 = &local_c8.fpclass;
          piVar12 = &local_c8.prec_elem;
        }
        iVar2 = *piVar8;
        bVar1 = *pbVar9;
        fVar3 = *pfVar11;
        iVar4 = *piVar12;
        *(ulong *)((__return_storage_ptr__->m_backend).data._M_elems + 8) =
             CONCAT35(local_c8.data._M_elems[9]._1_3_,local_c8.data._M_elems._32_5_);
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) =
             local_c8.data._M_elems._16_8_;
        *(ulong *)((__return_storage_ptr__->m_backend).data._M_elems + 6) =
             CONCAT35(local_c8.data._M_elems[7]._1_3_,local_c8.data._M_elems._24_5_);
        *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems =
             local_c8.data._M_elems._0_8_;
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) =
             local_c8.data._M_elems._8_8_;
        (__return_storage_ptr__->m_backend).exp = iVar2;
        (__return_storage_ptr__->m_backend).neg = bVar1;
        (__return_storage_ptr__->m_backend).fpclass = fVar3;
        (__return_storage_ptr__->m_backend).prec_elem = iVar4;
      }
      else {
        tVar7 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)((long)&((this->thePvec->
                                       super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       ).val.
                                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->m_backend +
                              lVar13),
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)((long)&(((this->theLbound->val).
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->m_backend).data
                              + lVar13));
        if (tVar7) {
          local_68.fpclass = cpp_dec_float_finite;
          local_68.prec_elem = 10;
          local_68.data._M_elems[0] = 0;
          local_68.data._M_elems[1] = 0;
          local_68.data._M_elems[2] = 0;
          local_68.data._M_elems[3] = 0;
          local_68.data._M_elems[4] = 0;
          local_68.data._M_elems[5] = 0;
          local_68.data._M_elems._24_5_ = 0;
          local_68.data._M_elems[7]._1_3_ = 0;
          local_68.data._M_elems._32_5_ = 0;
          local_68._37_8_ = 0;
          boost::multiprecision::default_ops::
          eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&local_68,
                     (cpp_dec_float<50U,_int,_void> *)
                     ((long)&(((this->theLbound->val).
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + lVar13)
                     ,(cpp_dec_float<50U,_int,_void> *)
                      ((long)&((this->thePvec->
                               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_backend + lVar13));
          tVar7 = boost::multiprecision::operator>
                            (__return_storage_ptr__,
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_68);
          if (tVar7) goto LAB_001eeab7;
          pnVar5 = (this->theLbound->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pnVar10 = (this->thePvec->
                    super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          goto LAB_001eeafd;
        }
      }
      lVar13 = lVar13 + 0x38;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

R SPxSolverBase<R>::maxInfeas() const
   {
      R inf = 0.0;

      if(type() == ENTER)
      {
         if(m_pricingViolUpToDate && m_pricingViolCoUpToDate)
            inf = m_pricingViol + m_pricingViolCo;

         for(int i = 0; i < dim(); i++)
         {
            if((*theFvec)[i] > theUBbound[i])
               inf = SOPLEX_MAX(inf, (*theFvec)[i] - theUBbound[i]);
            else if((*theFvec)[i] < theLBbound[i])
               inf = SOPLEX_MAX(inf, theLBbound[i] - (*theFvec)[i]);
         }
      }
      else
      {
         assert(type() == LEAVE);

         if(m_pricingViolUpToDate)
            inf = m_pricingViol;

         for(int i = 0; i < dim(); i++)
         {
            if((*theCoPvec)[i] > (*theCoUbound)[i])
               inf = SOPLEX_MAX(inf, (*theCoPvec)[i] - (*theCoUbound)[i]);
            else if((*theCoPvec)[i] < (*theCoLbound)[i])
               inf = SOPLEX_MAX(inf, (*theCoLbound)[i] - (*theCoPvec)[i]);
         }

         for(int i = 0; i < coDim(); i++)
         {
            if((*thePvec)[i] > (*theUbound)[i])
               inf = SOPLEX_MAX(inf, (*thePvec)[i] - (*theUbound)[i]);
            else if((*thePvec)[i] < (*theLbound)[i])
               inf = SOPLEX_MAX(inf, (*theLbound)[i] - (*thePvec)[i]);
         }
      }

      return inf;
   }